

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O3

bool __thiscall
de::cmdline::detail::Parser::parse
          (Parser *this,int numArgs,char **args,CommandLine *dst,ostream *err)

{
  char cVar1;
  undefined1 *puVar2;
  ostream *poVar3;
  char **ppcVar4;
  _Base_ptr p_Var5;
  uint uVar6;
  int iVar7;
  mapped_type *ppOVar8;
  SetDefaultFunc p_Var9;
  ulong uVar10;
  size_t sVar11;
  char *pcVar12;
  const_iterator cVar13;
  Entry *pEVar14;
  _Rb_tree_header *p_Var15;
  _Base_ptr p_Var16;
  byte bVar17;
  char *pcVar18;
  int iVar19;
  char *pcVar20;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  *p_Var21;
  _Base_ptr p_Var22;
  _Base_ptr p_Var23;
  pointer pOVar24;
  long lVar25;
  OptInfo *opt;
  OptSet seenOpts;
  OptMap longOptMap;
  OptMap shortOptMap;
  allocator<char> local_111;
  undefined4 local_110;
  int local_10c;
  key_type local_108;
  CommandLine *local_e8;
  ostream *local_e0;
  ulong local_d8;
  char **local_d0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_c8;
  _Rb_tree<const_de::cmdline::detail::Parser::OptInfo_*,_const_de::cmdline::detail::Parser::OptInfo_*,_std::_Identity<const_de::cmdline::detail::Parser::OptInfo_*>,_std::less<const_de::cmdline::detail::Parser::OptInfo_*>,_std::allocator<const_de::cmdline::detail::Parser::OptInfo_*>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  p_Var9 = (SetDefaultFunc)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var15 = &local_c0._M_impl.super__Rb_tree_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pOVar24 = (this->m_options).
            super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_10c = numArgs;
  local_e8 = dst;
  local_e0 = err;
  local_d0 = args;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var15->_M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var15->_M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pOVar24 !=
      (this->m_options).
      super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (pOVar24->shortName != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,pOVar24->shortName,&local_111);
        ppOVar8 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
                                *)&local_60,&local_108);
        *ppOVar8 = pOVar24;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
      }
      if (pOVar24->longName != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,pOVar24->longName,&local_111);
        ppOVar8 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
                                *)&local_90,&local_108);
        *ppOVar8 = pOVar24;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
      }
      if (pOVar24->defaultValue == (char *)0x0) {
        p_Var9 = pOVar24->setDefault;
        if (p_Var9 != (SetDefaultFunc)0x0) {
          p_Var9 = (SetDefaultFunc)(*p_Var9)(&local_e8->m_options);
        }
      }
      else {
        p_Var9 = (SetDefaultFunc)
                 (*pOVar24->dispatchParse)(pOVar24,pOVar24->defaultValue,&local_e8->m_options);
      }
      pOVar24 = pOVar24 + 1;
    } while (pOVar24 !=
             (this->m_options).
             super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_10c < 1) {
    local_110 = (undefined4)CONCAT71((int7)((ulong)p_Var9 >> 8),1);
  }
  else {
    local_c8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &local_e8->m_args;
    uVar10 = 0;
    local_110 = (undefined4)CONCAT71((int7)((ulong)p_Var15 >> 8),1);
    iVar7 = local_10c;
    do {
      pcVar20 = local_d0[(int)uVar10];
      local_d8 = uVar10;
      sVar11 = strlen(pcVar20);
      ppcVar4 = local_d0;
      if (*pcVar20 != '-') {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        sVar11 = strlen(pcVar20);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,pcVar20,pcVar20 + sVar11);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_c8,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        goto LAB_019e66f7;
      }
      cVar1 = pcVar20[1];
      lVar25 = 1;
      if ((cVar1 == '-') && (lVar25 = 2, pcVar20[2] == '\0')) {
        iVar7 = (uint)local_d8 + 1;
        if (iVar7 < local_10c) {
          iVar19 = ~(uint)local_d8 + local_10c;
          lVar25 = 0;
          do {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_108,ppcVar4[iVar7 + lVar25],&local_111);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_c8,&local_108);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            lVar25 = lVar25 + 1;
          } while (iVar19 != (int)lVar25);
        }
        break;
      }
      pcVar18 = pcVar20 + (int)sVar11;
      local_108._M_dataplus._M_p._0_1_ = 0x3d;
      pcVar12 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (pcVar20 + lVar25,pcVar18,&local_108);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,pcVar20 + lVar25,pcVar12)
      ;
      p_Var21 = &local_60;
      if (cVar1 == '-') {
        p_Var21 = &local_90;
      }
      cVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
               ::find(p_Var21,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      poVar3 = local_e0;
      iVar7 = local_10c;
      p_Var21 = &local_60;
      if (cVar1 == '-') {
        p_Var21 = &local_90;
      }
      if ((_Rb_tree_header *)cVar13._M_node == &(p_Var21->_M_impl).super__Rb_tree_header) {
        local_108._M_dataplus._M_p = (pointer)0x0;
LAB_019e66a9:
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_e0,"Unrecognized command line option \'",0x22);
        sVar11 = strlen(pcVar20);
        lVar25 = 2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar20,sVar11);
        pcVar20 = "\'\n";
LAB_019e66df:
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar20,lVar25);
LAB_019e66ea:
        local_110 = 0;
      }
      else {
        local_108._M_dataplus._M_p = *(pointer *)(cVar13._M_node + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_019e66a9;
        iVar19 = (int)local_e0;
        if (local_c0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var5 = local_c0._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var23 = &local_c0._M_impl.super__Rb_tree_header._M_header;
          do {
            p_Var22 = p_Var23;
            p_Var16 = p_Var5;
            puVar2 = *(undefined1 **)(p_Var16 + 1);
            p_Var23 = p_Var16;
            if (puVar2 < local_108._M_dataplus._M_p) {
              p_Var23 = p_Var22;
            }
            p_Var5 = (&p_Var16->_M_left)[puVar2 < local_108._M_dataplus._M_p];
          } while ((&p_Var16->_M_left)[puVar2 < local_108._M_dataplus._M_p] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var23 == &local_c0._M_impl.super__Rb_tree_header)
          goto LAB_019e65e2;
          if (puVar2 < local_108._M_dataplus._M_p) {
            p_Var16 = p_Var22;
          }
          if (local_108._M_dataplus._M_p < *(undefined1 **)(p_Var16 + 1)) goto LAB_019e65e2;
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_e0,"Command line option \'--",0x17);
          pcVar20 = *(char **)(local_108._M_dataplus._M_p + 8);
          if (pcVar20 == (char *)0x0) {
            lVar25 = 0x1b;
            std::ios::clear((int)poVar3->_vptr_basic_ostream[-3] + iVar19);
            pcVar20 = "\' specified multiple times\n";
          }
          else {
            sVar11 = strlen(pcVar20);
            lVar25 = 0x1b;
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar20,sVar11);
            pcVar20 = "\' specified multiple times\n";
          }
          goto LAB_019e66df;
        }
LAB_019e65e2:
        std::
        _Rb_tree<de::cmdline::detail::Parser::OptInfo_const*,de::cmdline::detail::Parser::OptInfo_const*,std::_Identity<de::cmdline::detail::Parser::OptInfo_const*>,std::less<de::cmdline::detail::Parser::OptInfo_const*>,std::allocator<de::cmdline::detail::Parser::OptInfo_const*>>
        ::_M_insert_unique<de::cmdline::detail::Parser::OptInfo_const*const&>
                  ((_Rb_tree<de::cmdline::detail::Parser::OptInfo_const*,de::cmdline::detail::Parser::OptInfo_const*,std::_Identity<de::cmdline::detail::Parser::OptInfo_const*>,std::less<de::cmdline::detail::Parser::OptInfo_const*>,std::allocator<de::cmdline::detail::Parser::OptInfo_const*>>
                    *)&local_c0,(OptInfo **)&local_108);
        if (local_108._M_dataplus._M_p[0x20] != '\x01') {
          uVar6 = (int)local_d8 + 1;
          if (((int)uVar6 < iVar7) || (pcVar12 != pcVar18)) {
            if (pcVar12 == pcVar18) {
              pcVar12 = local_d0[(int)uVar6];
              local_d8 = (ulong)uVar6;
            }
            else {
              pcVar12 = pcVar12 + 1;
            }
            (**(code **)(local_108._M_dataplus._M_p + 0x48))
                      (local_108._M_dataplus._M_p,pcVar12,local_e8);
            goto LAB_019e66f7;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"Expected value for command line option \'--",0x2a);
          pcVar20 = *(char **)(local_108._M_dataplus._M_p + 8);
          if (pcVar20 == (char *)0x0) {
            std::ios::clear((int)poVar3->_vptr_basic_ostream[-3] + iVar19);
          }
          else {
            sVar11 = strlen(pcVar20);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar20,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
          goto LAB_019e66ea;
        }
        if (pcVar12 != pcVar18) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"No value expected for command line option \'--",0x2d);
          pcVar20 = *(char **)(local_108._M_dataplus._M_p + 8);
          if (pcVar20 == (char *)0x0) {
            std::ios::clear((int)poVar3->_vptr_basic_ostream[-3] + iVar19);
          }
          else {
            sVar11 = strlen(pcVar20);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar20,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
          goto LAB_019e66ea;
        }
        (**(code **)(local_108._M_dataplus._M_p + 0x48))(local_108._M_dataplus._M_p,0,local_e8);
      }
LAB_019e66f7:
      uVar6 = (int)local_d8 + 1;
      uVar10 = (ulong)uVar6;
    } while ((int)uVar6 < iVar7);
  }
  pEVar14 = TypedFieldMap::get(&local_e8->m_options,
                               (type_info *)&cmdline::(anonymous_namespace)::Help::typeinfo);
  bVar17 = (*pEVar14->value ^ 1) & (byte)local_110;
  std::
  _Rb_tree<const_de::cmdline::detail::Parser::OptInfo_*,_const_de::cmdline::detail::Parser::OptInfo_*,_std::_Identity<const_de::cmdline::detail::Parser::OptInfo_*>,_std::less<const_de::cmdline::detail::Parser::OptInfo_*>,_std::allocator<const_de::cmdline::detail::Parser::OptInfo_*>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  ::~_Rb_tree(&local_60);
  return (bool)bVar17;
}

Assistant:

bool Parser::parse (int numArgs, const char* const* args, CommandLine* dst, std::ostream& err) const
{
	typedef map<string, const OptInfo*> OptMap;
	typedef set<const OptInfo*> OptSet;

	OptMap	shortOptMap;
	OptMap	longOptMap;
	OptSet	seenOpts;
	bool	allOk			= true;

	DE_ASSERT(dst->m_args.empty() && dst->m_options.empty());

	for (vector<OptInfo>::const_iterator optIter = m_options.begin(); optIter != m_options.end(); optIter++)
	{
		const OptInfo& opt = *optIter;

		DE_ASSERT(opt.shortName || opt.longName);

		if (opt.shortName)
		{
			DE_ASSERT(shortOptMap.find(opt.shortName) == shortOptMap.end());
			shortOptMap[opt.shortName] = &opt;
		}

		if (opt.longName)
		{
			DE_ASSERT(longOptMap.find(opt.longName) == longOptMap.end());
			longOptMap[opt.longName] = &opt;
		}

		// Set default values.
		if (opt.defaultValue)
			opt.dispatchParse(&opt, opt.defaultValue, &dst->m_options);
		else if (opt.setDefault)
			opt.setDefault(&dst->m_options);
	}

	DE_ASSERT(!dst->m_options.get<Help>());

	for (int argNdx = 0; argNdx < numArgs; argNdx++)
	{
		const char*		arg		= args[argNdx];
		int				argLen	= (int)strlen(arg);

		if (arg[0] == '-' && arg[1] == '-' && arg[2] == 0)
		{
			// End of option list (--)
			for (int optNdx = argNdx+1; optNdx < numArgs; optNdx++)
				dst->m_args.push_back(args[optNdx]);
			break;
		}
		else if (arg[0] == '-')
		{
			const bool				isLongName	= arg[1] == '-';
			const char*				nameStart	= arg + (isLongName ? 2 : 1);
			const char*				nameEnd		= std::find(nameStart, arg+argLen, '=');
			const bool				hasImmValue	= nameEnd != (arg+argLen);
			const OptMap&			optMap		= isLongName ? longOptMap : shortOptMap;
			OptMap::const_iterator	optPos		= optMap.find(string(nameStart, nameEnd));
			const OptInfo*			opt			= optPos != optMap.end() ? optPos->second : DE_NULL;

			if (!opt)
			{
				err << "Unrecognized command line option '" << arg << "'\n";
				allOk = false;
				continue;
			}

			if (seenOpts.find(opt) != seenOpts.end())
			{
				err << "Command line option '--" << opt->longName << "' specified multiple times\n";
				allOk = false;
				continue;
			}

			seenOpts.insert(opt);

			if (opt->isFlag)
			{
				if (!hasImmValue)
				{
					opt->dispatchParse(opt, DE_NULL, &dst->m_options);
				}
				else
				{
					err << "No value expected for command line option '--" << opt->longName << "'\n";
					allOk = false;
				}
			}
			else
			{
				const bool	hasValue	= hasImmValue || (argNdx+1 < numArgs);

				if (hasValue)
				{
					const char*	value	= hasValue ? (hasImmValue ? nameEnd+1 : args[argNdx+1]) : DE_NULL;

					if (!hasImmValue)
						argNdx += 1; // Skip value

					try
					{
						opt->dispatchParse(opt, value, &dst->m_options);
					}
					catch (const std::exception& e)
					{
						err << "Got error parsing command line option '--" << opt->longName << "': " << e.what() << "\n";
						allOk = false;
					}
				}
				else
				{
					err << "Expected value for command line option '--" << opt->longName << "'\n";
					allOk = false;
				}
			}
		}
		else
		{
			// Not an option
			dst->m_args.push_back(arg);
		}
	}

	// Help specified?
	if (dst->m_options.get<Help>())
		allOk = false;

	return allOk;
}